

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::LookupLe(ImageInfiniteLight *this,Point2f st,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  RGB *pRVar2;
  int c;
  int c_00;
  Float FVar3;
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar6;
  RGB local_98;
  Tuple2<pbrt::Point2,_float> local_88;
  SampledWavelengths *local_70;
  SampledSpectrum local_68;
  RGBSpectrum local_58;
  undefined1 auVar5 [56];
  
  local_98.r = 0.0;
  local_98.g = 0.0;
  local_98.b = 0.0;
  local_88 = st.super_Tuple2<pbrt::Point2,_float>;
  local_70 = lambda;
  for (c_00 = 0; c_00 != 3; c_00 = c_00 + 1) {
    FVar3 = Image::LookupNearestChannel
                      (&this->image,(Point2f)local_88,c_00,
                       (array<pbrt::WrapMode,_2>)
                       *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
    pRVar2 = &local_98;
    if ((c_00 != 0) && (pRVar2 = (RGB *)&local_98.g, c_00 != 1)) {
      pRVar2 = (RGB *)&local_98.b;
    }
    pRVar2->r = FVar3;
  }
  auVar5 = (undefined1  [56])0x0;
  local_88.x = this->scale;
  RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,&local_98);
  SVar6 = RGBSpectrum::Sample(&local_58,local_70);
  auVar4._0_8_ = SVar6.values.values._0_8_;
  auVar4._8_56_ = auVar5;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar6.values.values._8_8_;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar1);
  SVar6 = SampledSpectrum::operator*(&local_68,local_88.x);
  return (array<float,_4>)(array<float,_4>)SVar6;
}

Assistant:

LookupLe(Point2f st, const SampledWavelengths &lambda) const {
        RGB rgb;
        for (int c = 0; c < 3; ++c)
            rgb[c] = image.LookupNearestChannel(st, c, wrapMode);
        return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
    }